

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O1

vector<Token,_std::allocator<Token>_> *
Tokenize(vector<Token,_std::allocator<Token>_> *__return_storage_ptr__,istream *cl)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  istream *piVar3;
  logic_error *this;
  undefined8 uVar4;
  char cVar5;
  _Alloc_hider _Var6;
  int iVar7;
  char c;
  string date;
  Token local_88;
  vector<Token,_std::allocator<Token>_> *local_60;
  byte local_51;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  long local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_88.value.field_2;
  local_60 = __return_storage_ptr__;
switchD_0010905e_caseD_3f:
  piVar3 = std::operator>>(cl,(char *)&local_51);
  if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
    return local_60;
  }
  if ((int)(char)local_51 - 0x30U < 10) {
    local_50 = &local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,'\x01');
    iVar7 = 0;
    do {
      while( true ) {
        iVar2 = std::istream::peek();
        cVar5 = (char)(string *)&local_50;
        if (9 < iVar2 - 0x30U) break;
        std::istream::get();
        std::__cxx11::string::push_back(cVar5);
      }
      if (iVar7 != 2) {
        std::istream::get();
        std::__cxx11::string::push_back(cVar5);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != 3);
    local_88.value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,local_50,local_50->_M_local_buf + local_48);
    local_88.type = DATE;
    std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>(local_60,&local_88);
    goto LAB_00109000;
  }
  if (local_51 < 0x3c) goto code_r0x001090b9;
  if (local_51 < 0x4f) {
    switch(local_51) {
    case 0x3c:
      iVar7 = std::istream::peek();
      if (iVar7 == 0x3d) {
        std::istream::get();
        local_88.value._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"<=","");
        local_88.type = COMPARE_OP;
        std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>(local_60,&local_88);
      }
      else {
        local_88.value._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"<","");
        local_88.type = COMPARE_OP;
        std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>(local_60,&local_88);
      }
      break;
    case 0x3d:
      iVar7 = std::istream::get();
      if (iVar7 != 0x3d) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this,"Unknown token");
        goto LAB_0010953d;
      }
      local_88.value._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"==","");
      local_88.type = COMPARE_OP;
      std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>(local_60,&local_88);
      break;
    case 0x3e:
      iVar7 = std::istream::peek();
      if (iVar7 == 0x3d) {
        std::istream::get();
        local_88.value._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,">=","");
        local_88.type = COMPARE_OP;
        std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>(local_60,&local_88);
      }
      else {
        local_88.value._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,">","");
        local_88.type = COMPARE_OP;
        std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>(local_60,&local_88);
      }
      break;
    default:
      goto switchD_0010905e_caseD_3f;
    case 0x41:
      iVar7 = std::istream::get();
      if ((iVar7 != 0x4e) || (iVar7 = std::istream::get(), iVar7 != 0x44)) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this,"Unknown token");
        goto LAB_0010953d;
      }
      local_88.value._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"AND","");
      local_88.type = LOGICAL_OP;
      std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>(local_60,&local_88);
    }
  }
  else if (local_51 == 0x4f) {
    iVar7 = std::istream::get();
    if (iVar7 != 0x52) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"Unknown token");
      goto LAB_0010953d;
    }
    local_88.value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"OR","");
    local_88.type = LOGICAL_OP;
    std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>(local_60,&local_88);
  }
  else if (local_51 == 100) {
    iVar7 = std::istream::get();
    if (((iVar7 != 0x61) || (iVar7 = std::istream::get(), iVar7 != 0x74)) ||
       (iVar7 = std::istream::get(), iVar7 != 0x65)) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"Unknown token");
      goto LAB_0010953d;
    }
    local_88.value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"date","");
    local_88.type = COLUMN;
    std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>(local_60,&local_88);
  }
  else {
    if (local_51 != 0x65) goto switchD_0010905e_caseD_3f;
    iVar7 = std::istream::get();
    if (((iVar7 != 0x76) || (iVar7 = std::istream::get(), iVar7 != 0x65)) ||
       ((iVar7 = std::istream::get(), iVar7 != 0x6e || (iVar7 = std::istream::get(), iVar7 != 0x74))
       )) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"Unknown token");
      goto LAB_0010953d;
    }
    local_88.value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"event","");
    local_88.type = COLUMN;
    std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>(local_60,&local_88);
  }
LAB_00109455:
  uVar4 = local_88.value.field_2._M_allocated_capacity;
  _Var6._M_p = local_88.value._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.value._M_dataplus._M_p == paVar1) goto switchD_0010905e_caseD_3f;
LAB_00109467:
  operator_delete(_Var6._M_p,uVar4 + 1);
  goto switchD_0010905e_caseD_3f;
code_r0x001090b9:
  switch(local_51) {
  case 0x21:
    iVar7 = std::istream::get();
    if (iVar7 != 0x3d) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"Unknown token");
LAB_0010953d:
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    local_88.value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"!=","");
    local_88.type = COMPARE_OP;
    std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>(local_60,&local_88);
    break;
  case 0x22:
    local_50 = &local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>(cl,(string *)&local_50,'\"');
    local_88.value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,local_50,local_50->_M_local_buf + local_48);
    local_88.type = EVENT;
    std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>(local_60,&local_88);
LAB_00109000:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.value._M_dataplus._M_p != paVar1) {
      operator_delete(local_88.value._M_dataplus._M_p,
                      local_88.value.field_2._M_allocated_capacity + 1);
    }
    if (local_50 == &local_40) goto switchD_0010905e_caseD_3f;
    uVar4 = CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]);
    _Var6._M_p = (pointer)local_50;
    goto LAB_00109467;
  default:
    goto switchD_0010905e_caseD_3f;
  case 0x28:
    local_88.value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"(","");
    local_88.type = PAREN_LEFT;
    std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>(local_60,&local_88);
    break;
  case 0x29:
    local_88.value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,")","");
    local_88.type = PAREN_RIGHT;
    std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>(local_60,&local_88);
  }
  goto LAB_00109455;
}

Assistant:

vector<Token> Tokenize(istream& cl) {
  vector<Token> tokens;

  char c;
  while (cl >> c) {
    if (isdigit(c)) {
      string date(1, c);
      for (int i = 0; i < 3; ++i) {
        while (isdigit(cl.peek())) {
          date += cl.get();
        }
        if (i < 2) {
          date += cl.get(); // Consume '-'
        }
      }
      tokens.push_back({date, TokenType::DATE});
    } else if (c == '"') {
      string event;
      getline(cl, event, '"');
      tokens.push_back({event, TokenType::EVENT});
    } else if (c == 'd') {
      if (cl.get() == 'a' && cl.get() == 't' && cl.get() == 'e') {
        tokens.push_back({"date", TokenType::COLUMN});
      } else {
        throw logic_error("Unknown token");
      }
    } else if (c == 'e') {
      if (cl.get() == 'v' && cl.get() == 'e' && cl.get() == 'n' &&
          cl.get() == 't') {
        tokens.push_back({"event", TokenType::COLUMN});
      } else {
        throw logic_error("Unknown token");
      }
    } else if (c == 'A') {
      if (cl.get() == 'N' && cl.get() == 'D') {
        tokens.push_back({"AND", TokenType::LOGICAL_OP});
      } else {
        throw logic_error("Unknown token");
      }
    } else if (c == 'O') {
      if (cl.get() == 'R') {
        tokens.push_back({"OR", TokenType::LOGICAL_OP});
      } else {
        throw logic_error("Unknown token");
      }
    } else if (c == '(') {
      tokens.push_back({"(", TokenType::PAREN_LEFT});
    } else if (c == ')') {
      tokens.push_back({")", TokenType::PAREN_RIGHT});
    } else if (c == '<') {
      if (cl.peek() == '=') {
        cl.get();
        tokens.push_back({"<=", TokenType::COMPARE_OP});
      } else {
        tokens.push_back({"<", TokenType::COMPARE_OP});
      }
    } else if (c == '>') {
      if (cl.peek() == '=') {
        cl.get();
        tokens.push_back({">=", TokenType::COMPARE_OP});
      } else {
        tokens.push_back({">", TokenType::COMPARE_OP});
      }
    } else if (c == '=') {
      if (cl.get() == '=') {
        tokens.push_back({"==", TokenType::COMPARE_OP});
      } else {
        throw logic_error("Unknown token");
      }
    } else if (c == '!') {
      if (cl.get() == '=') {
        tokens.push_back({"!=", TokenType::COMPARE_OP});
      } else {
        throw logic_error("Unknown token");
      }
    }
  }

  return tokens;
}